

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

uint Gia_Iso2ManCone_rec(Gia_Man_t *p,int Id,int Level)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    iVar5 = 0;
    while( true ) {
      uVar3 = 0;
      if (Level == 0) goto LAB_005881c9;
      iVar2 = Gia_ObjIsTravIdCurrentId(p,Id);
      uVar3 = 0;
      if (iVar2 != 0) goto LAB_005881c9;
      Gia_ObjSetTravIdCurrentId(p,Id);
      pGVar4 = Gia_ManObj(p,Id);
      uVar3 = (uint)*(undefined8 *)pGVar4;
      if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) break;
      Level = Level + -1;
      uVar1 = pGVar4->Value;
      uVar3 = Gia_Iso2ManCone_rec(p,Id - (uVar3 & 0x1fffffff),Level);
      Id = Id - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff);
      iVar5 = iVar5 + uVar1 + uVar3;
    }
    iVar2 = Gia_ObjIsPi(p,pGVar4);
    if (iVar2 != 0) goto LAB_005881c4;
    iVar2 = Gia_ObjIsRo(p,pGVar4);
    if (iVar2 == 0) break;
    uVar3 = pGVar4->Value;
    pGVar4 = Gia_ObjRoToRi(p,pGVar4);
    Id = Gia_ObjId(p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
    local_34 = local_34 + iVar5 + uVar3;
  }
  if ((~*(ulong *)pGVar4 & 0x1fffffff1fffffff) != 0) {
    __assert_fail("Gia_ObjIsConst0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso2.c"
                  ,0xbb,"unsigned int Gia_Iso2ManCone_rec(Gia_Man_t *, int, int)");
  }
LAB_005881c4:
  uVar3 = pGVar4->Value;
LAB_005881c9:
  return iVar5 + local_34 + uVar3;
}

Assistant:

unsigned Gia_Iso2ManCone_rec( Gia_Man_t * p, int Id, int Level )
{
    Gia_Obj_t * pObj;
    if ( Level == 0 )
        return 0;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
        return pObj->Value + Gia_Iso2ManCone_rec( p, Gia_ObjFaninId0(pObj, Id), Level-1 ) + Gia_Iso2ManCone_rec( p, Gia_ObjFaninId1(pObj, Id), Level-1 );
    if ( Gia_ObjIsPi(p, pObj) )
        return pObj->Value;
    if ( Gia_ObjIsRo(p, pObj) )
        return pObj->Value + Gia_Iso2ManCone_rec( p, Gia_ObjId(p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj))), Level );
    assert( Gia_ObjIsConst0(pObj) );
    return pObj->Value;
}